

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CodeEditor.cxx
# Opt level: O0

void CodeEditor::style_update
               (int pos,int nInserted,int nDeleted,int param_4,char *param_5,void *cbArg)

{
  char cVar1;
  int iVar2;
  fd_set *text_00;
  undefined4 in_register_0000000c;
  fd_set *__writefds;
  timeval *ptVar3;
  char *pcStack_50;
  int altStart;
  char *text;
  char *style;
  int iStack_34;
  char last;
  int end;
  int start;
  CodeEditor *editor;
  void *cbArg_local;
  char *param_4_local;
  int param_3_local;
  int nDeleted_local;
  int nInserted_local;
  int pos_local;
  
  __writefds = (fd_set *)CONCAT44(in_register_0000000c,param_4);
  if ((nInserted == 0) && (nDeleted == 0)) {
    Fl_Text_Buffer::unselect(*(Fl_Text_Buffer **)((long)cbArg + 0xd8));
  }
  else {
    ptVar3 = (timeval *)cbArg;
    if (nInserted < 1) {
      Fl_Text_Buffer::remove(*(Fl_Text_Buffer **)((long)cbArg + 0xd8),(char *)(ulong)(uint)pos);
    }
    else {
      text_00 = (fd_set *)operator_new__((long)(nInserted + 1));
      memset(text_00,0x41,(long)nInserted);
      *(char *)((long)text_00->fds_bits + (long)nInserted) = '\0';
      __writefds = text_00;
      Fl_Text_Buffer::replace
                (*(Fl_Text_Buffer **)((long)cbArg + 0xd8),pos,pos + nDeleted,(char *)text_00);
      if (text_00 != (fd_set *)0x0) {
        operator_delete__(text_00);
      }
    }
    Fl_Text_Buffer::select
              (*(Fl_Text_Buffer **)((long)cbArg + 0xd8),pos,
               (fd_set *)(ulong)(uint)((pos + nInserted) - nDeleted),__writefds,(fd_set *)param_5,
               ptVar3);
    iStack_34 = Fl_Text_Buffer::line_start(*(Fl_Text_Buffer **)((long)cbArg + 0xd0),pos);
    iVar2 = Fl_Text_Buffer::prev_char(*(Fl_Text_Buffer **)((long)cbArg + 0xd0),iStack_34);
    if (((0 < iVar2) &&
        (iVar2 = Fl_Text_Buffer::prev_char(*(Fl_Text_Buffer **)((long)cbArg + 0xd0),iVar2),
        -1 < iVar2)) &&
       (cVar1 = Fl_Text_Buffer::byte_at(*(Fl_Text_Buffer **)((long)cbArg + 0xd8),iStack_34 + -2),
       cVar1 == 'C')) {
      iStack_34 = Fl_Text_Buffer::line_start(*(Fl_Text_Buffer **)((long)cbArg + 0xd0),iVar2);
    }
    iVar2 = Fl_Text_Buffer::line_end(*(Fl_Text_Buffer **)((long)cbArg + 0xd0),pos + nInserted);
    pcStack_50 = Fl_Text_Buffer::text_range
                           (*(Fl_Text_Buffer **)((long)cbArg + 0xd0),iStack_34,iVar2);
    text = Fl_Text_Buffer::text_range(*(Fl_Text_Buffer **)((long)cbArg + 0xd8),iStack_34,iVar2);
    if (iStack_34 == iVar2) {
      style._7_1_ = '\0';
    }
    else {
      style._7_1_ = text[(iVar2 - iStack_34) + -1];
    }
    style_parse(pcStack_50,text,iVar2 - iStack_34);
    Fl_Text_Buffer::replace(*(Fl_Text_Buffer **)((long)cbArg + 0xd8),iStack_34,iVar2,text);
    Fl_Text_Display::redisplay_range((Fl_Text_Display *)cbArg,iStack_34,iVar2);
    if ((iStack_34 == iVar2) || (style._7_1_ != text[(iVar2 - iStack_34) + -1])) {
      free(pcStack_50);
      free(text);
      iVar2 = Fl_Text_Buffer::length(*(Fl_Text_Buffer **)((long)cbArg + 0xd0));
      pcStack_50 = Fl_Text_Buffer::text_range
                             (*(Fl_Text_Buffer **)((long)cbArg + 0xd0),iStack_34,iVar2);
      text = Fl_Text_Buffer::text_range(*(Fl_Text_Buffer **)((long)cbArg + 0xd8),iStack_34,iVar2);
      style_parse(pcStack_50,text,iVar2 - iStack_34);
      Fl_Text_Buffer::replace(*(Fl_Text_Buffer **)((long)cbArg + 0xd8),iStack_34,iVar2,text);
      Fl_Text_Display::redisplay_range((Fl_Text_Display *)cbArg,iStack_34,iVar2);
    }
    free(pcStack_50);
    free(text);
  }
  return;
}

Assistant:

void CodeEditor::style_update(int pos, int nInserted, int nDeleted,
                              int /*nRestyled*/, const char * /*deletedText*/,
                              void *cbArg) {
  CodeEditor	*editor = (CodeEditor *)cbArg;
  int		start,				// Start of text
		end;				// End of text
  char		last,				// Last style on line
		*style,				// Style data
		*text;				// Text data


  // If this is just a selection change, just unselect the style buffer...
  if (nInserted == 0 && nDeleted == 0) {
    editor->mStyleBuffer->unselect();
    return;
  }

  // Track changes in the text buffer...
  if (nInserted > 0) {
    // Insert characters into the style buffer...
    style = new char[nInserted + 1];
    memset(style, 'A', nInserted);
    style[nInserted] = '\0';

    editor->mStyleBuffer->replace(pos, pos + nDeleted, style);
    delete[] style;
  } else {
    // Just delete characters in the style buffer...
    editor->mStyleBuffer->remove(pos, pos + nDeleted);
  }

  // Select the area that was just updated to avoid unnecessary
  // callbacks...
  editor->mStyleBuffer->select(pos, pos + nInserted - nDeleted);

  // Re-parse the changed region; we do this by parsing from the
  // beginning of the line of the changed region to the end of
  // the line of the changed region...  Then we check the last
  // style character and keep updating if we have a multi-line
  // comment character...
  start = editor->mBuffer->line_start(pos);
  // the following code checks the style of the last character of the previous
  // line. If it is a block comment, the previous line is interpreted as well.
  int altStart = editor->mBuffer->prev_char(start);
  if (altStart>0) {
    altStart = editor->mBuffer->prev_char(altStart);
    if (altStart>=0 && editor->mStyleBuffer->byte_at(start-2)=='C')
      start = editor->mBuffer->line_start(altStart);
  }
  end   = editor->mBuffer->line_end(pos + nInserted);
  text  = editor->mBuffer->text_range(start, end);
  style = editor->mStyleBuffer->text_range(start, end);
  if (start==end)
    last = 0;
  else
    last  = style[end - start - 1];

  style_parse(text, style, end - start);

  editor->mStyleBuffer->replace(start, end, style);
  editor->redisplay_range(start, end);

  if (start==end || last != style[end - start - 1]) {
    // The last character on the line changed styles, so reparse the
    // remainder of the buffer...
    free(text);
    free(style);

    end   = editor->mBuffer->length();
    text  = editor->mBuffer->text_range(start, end);
    style = editor->mStyleBuffer->text_range(start, end);

    style_parse(text, style, end - start);

    editor->mStyleBuffer->replace(start, end, style);
    editor->redisplay_range(start, end);
  }

  free(text);
  free(style);
}